

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O2

void __thiscall
absl::Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Flag
          (Flag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,char *name,char *type,char *help,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *default_value)

{
  shared_ptr<absl::internal::FlagFunc> *this_00;
  element_type *peVar1;
  FlagFunc *__p;
  allocator<char> local_ca;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  __shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->_vptr_Flag = (_func_int **)&PTR__Flag_003b65e8;
  local_a8 = &this->value_;
  std::__cxx11::string::string((string *)local_a8,(string *)default_value);
  __p = (FlagFunc *)operator_new(0x58);
  this_00 = &this->func_;
  (__p->default_value)._M_dataplus._M_p = (pointer)&(__p->default_value).field_2;
  (__p->default_value)._M_string_length = 0;
  (__p->default_value).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(__p->set_value).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__p->set_value).super__Function_base._M_functor + 8) = 0;
  (__p->set_value).super__Function_base._M_manager = (_Manager_type)0x0;
  (__p->set_value)._M_invoker = (_Invoker_type)0x0;
  std::__shared_ptr<absl::internal::FlagFunc,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<absl::internal::FlagFunc,void>
            ((__shared_ptr<absl::internal::FlagFunc,(__gnu_cxx::_Lock_policy)2> *)this_00,__p);
  peVar1 = (this_00->super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar1->name = name;
  peVar1->help = help;
  peVar1->type = type;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"\"",&local_c9);
  std::operator+(&local_c8,&local_90,default_value);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"\"",&local_ca);
  std::operator+(&local_50,&local_c8,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::operator=
            ((string *)
             &((this->func_).
               super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              default_value,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_c8._M_dataplus._M_p = (pointer)this;
  std::function<void(std::__cxx11::string_const&)>::operator=
            ((function<void(std::__cxx11::string_const&)> *)
             &((this->func_).
               super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              set_value,(anon_class_8_1_8991fb9c *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,name,(allocator<char> *)&local_90);
  std::__shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a0,
             &this_00->super___shared_ptr<absl::internal::FlagFunc,_(__gnu_cxx::_Lock_policy)2>);
  internal::RegisterFlag(&local_c8,(shared_ptr<absl::internal::FlagFunc> *)&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
  std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

Flag<T>::Flag(const char *name, const char *type, const char *help,
              const T &default_value)
    : value_(default_value), func_(new internal::FlagFunc) {
  func_->name = name;
  func_->help = help;
  func_->type = type;
  func_->default_value = internal::to_str<T>(default_value);
  func_->set_value = [this](const std::string &value) {
    this->set_value_as_str(value);
  };
  RegisterFlag(name, func_);
}